

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_zip_entry_open(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  long lVar1;
  char *zErr;
  int iBool;
  
  zErr = "Expecting a ZIP archive";
  if ((((1 < nArg) && (((*apArg)->iFlags & 0x100) != 0)) && ((apArg[1]->iFlags & 0x100) != 0)) &&
     ((lVar1 = ((*apArg)->x).iVal, lVar1 != 0 && (*(int *)(lVar1 + 0x50) == -0x21529ca6)))) {
    lVar1 = (apArg[1]->x).iVal;
    zErr = "Expecting a ZIP archive entry";
    if ((lVar1 != 0) && (*(int *)(lVar1 + 0xa0) == -0x21529ca6)) {
      iBool = 1;
      goto LAB_00134abc;
    }
  }
  jx9_context_throw_error(pCtx,1,zErr);
  iBool = 0;
LAB_00134abc:
  jx9_result_bool(pCtx,iBool);
  return 0;
}

Assistant:

static int jx9Builtin_zip_entry_open(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	SyArchiveEntry *pEntry;
	SyArchive *pArchive;
	if( nArg < 2 || !jx9_value_is_resource(apArg[0]) || !jx9_value_is_resource(apArg[1]) ){
		/* Missing/Invalid arguments */
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "Expecting a ZIP archive");
		/* return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the in-memory archive */
	pArchive = (SyArchive *)jx9_value_to_resource(apArg[0]);
	/* Make sure we are dealing with a valid ZIP archive */
	if( SXARCH_INVALID(pArchive) ){
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "Expecting a ZIP archive");
		/* return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Make sure we are dealing with a valid ZIP archive entry */
	pEntry = (SyArchiveEntry *)jx9_value_to_resource(apArg[1]);
	if( SXARCH_ENTRY_INVALID(pEntry) ){
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "Expecting a ZIP archive entry");
		/* return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* All done. Actually this function is a no-op, return TRUE */
	jx9_result_bool(pCtx, 1);
	return JX9_OK;
}